

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O1

void __thiscall
autoSimplification_associative5_Test::TestBody(autoSimplification_associative5_Test *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> ex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  pointer *__ptr;
  _func_int **message;
  ExprPtr EVar2;
  AssertionResult gtest_ar;
  ExprPtr e;
  ExprPtr z;
  ExprPtr y;
  ExprPtr x;
  ExprPtr n4;
  ExprPtr n3;
  ExprPtr n2;
  undefined1 local_148 [32];
  undefined1 local_128 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  long *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  long local_108 [2];
  ExprPtr local_f8;
  ExprPtr local_e8;
  ExprPtr local_d8;
  ExprPtr local_c8;
  ExprPtr local_b8;
  ExprPtr local_a8;
  ExprPtr local_98;
  ExprPtr local_88;
  ExprPtr local_78;
  ExprPtr local_68;
  ExprPtr local_58;
  ExprPtr local_48;
  ExprPtr local_38;
  ExprPtr local_28;
  
  local_98.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_98.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_use_count = 1;
  (local_98.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_weak_count = 1;
  (local_98.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_98.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_98.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  *(undefined4 *)
   &local_98.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = 2;
  *(undefined1 *)
   &local_98.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[4]._M_use_count = 0;
  local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_use_count = 1;
  (local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_weak_count = 1;
  (local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  *(undefined4 *)
   &local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = 3;
  *(undefined1 *)
   &local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[4]._M_use_count = 0;
  local_b8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_b8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_b8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_use_count = 1;
  (local_b8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_weak_count = 1;
  (local_b8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_b8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_b8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  *(undefined4 *)
   &local_b8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = 4;
  *(undefined1 *)
   &local_b8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[4]._M_use_count = 0;
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"x","");
  peVar1 = (element_type *)(local_148 + 0x10);
  local_148._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_148,local_118,
             (long)&local_110->_vptr__Sp_counted_base + (long)local_118);
  local_c8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mathiu::impl::Expr_const,std::allocator<mathiu::impl::Expr>,mathiu::impl::Symbol>
            (&local_c8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Expr **)&local_c8,(allocator<mathiu::impl::Expr> *)&local_d8,
             (Symbol *)local_148);
  if ((element_type *)local_148._0_8_ != peVar1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"y","");
  local_148._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_148,local_118,
             (long)&local_110->_vptr__Sp_counted_base + (long)local_118);
  local_d8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mathiu::impl::Expr_const,std::allocator<mathiu::impl::Expr>,mathiu::impl::Symbol>
            (&local_d8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Expr **)&local_d8,(allocator<mathiu::impl::Expr> *)&local_e8,
             (Symbol *)local_148);
  if ((element_type *)local_148._0_8_ != peVar1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"z","");
  local_148._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_148,local_118,
             (long)&local_110->_vptr__Sp_counted_base + (long)local_118);
  local_e8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mathiu::impl::Expr_const,std::allocator<mathiu::impl::Expr>,mathiu::impl::Symbol>
            (&local_e8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Expr **)&local_e8,(allocator<mathiu::impl::Expr> *)local_128,
             (Symbol *)local_148);
  if ((element_type *)local_148._0_8_ != peVar1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  mathiu::impl::operator*((impl *)&local_28,&local_c8,&local_d8);
  mathiu::impl::operator*((impl *)&local_f8,&local_28,&local_e8);
  mathiu::impl::operator*((impl *)local_128,&local_98,&local_f8);
  mathiu::impl::operator*((impl *)&local_48,&local_a8,&local_c8);
  mathiu::impl::operator*((impl *)&local_58,&local_d8,&local_e8);
  mathiu::impl::operator*((impl *)&local_38,&local_48,&local_58);
  mathiu::impl::operator+((impl *)local_148,(ExprPtr *)local_128,&local_38);
  mathiu::impl::operator*((impl *)&local_88,&local_c8,&local_d8);
  mathiu::impl::operator*((impl *)&local_78,&local_b8,&local_88);
  mathiu::impl::operator*((impl *)&local_68,&local_78,&local_e8);
  EVar2 = mathiu::impl::operator+((impl *)&local_118,(ExprPtr *)local_148,&local_68);
  ex = EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_68.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ex._M_pi = extraout_RDX;
  }
  if (local_78.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ex._M_pi = extraout_RDX_00;
  }
  if (local_88.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ex._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
    ex._M_pi = extraout_RDX_02;
  }
  if (local_38.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ex._M_pi = extraout_RDX_03;
  }
  if (local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ex._M_pi = extraout_RDX_04;
  }
  if (local_48.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ex._M_pi = extraout_RDX_05;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
    ex._M_pi = extraout_RDX_06;
  }
  if (local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ex._M_pi = extraout_RDX_07;
  }
  if (local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ex._M_pi = extraout_RDX_08;
  }
  mathiu::impl::toString_abi_cxx11_((string *)local_148,(impl *)&local_118,(ExprPtr *)ex._M_pi);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
            ((internal *)local_128,"toString(e)","\"(* 9 x y z)\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
             (char (*) [12])"(* 9 x y z)");
  if ((element_type *)local_148._0_8_ != peVar1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if (local_128[0] == (impl)0x0) {
    testing::Message::Message((Message *)local_148);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int **)0x20d5b4;
    }
    else {
      message = (_func_int **)((_Alloc_hider *)&(local_120._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x149,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((element_type *)local_148._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_148._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_128 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_120._M_pi);
  }
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  if (local_e8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_98.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(autoSimplification, associative5)
{
    auto const n2 = 2_i;
    auto const n3 = 3_i;
    auto const n4 = 4_i;
    auto const x = symbol("x");
    auto const y = symbol("y");
    auto const z = symbol("z");
    auto const e = n2 * (x * y * z) + n3 * x * (y * z) + n4 * (x * y) * z;
    EXPECT_EQ(toString(e), "(* 9 x y z)");
}